

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

int png_image_read_and_map(png_voidp argument)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined8 *puVar5;
  png_const_structrp png_ptr_00;
  long lVar6;
  long lVar7;
  png_byte pVar8;
  uint uVar9;
  long lVar10;
  png_const_bytep ppVar11;
  byte *pbVar12;
  png_bytep ppVar13;
  int local_ac;
  byte local_a8;
  byte local_9c;
  uint back_i;
  uint alpha_2;
  png_byte alpha_1;
  png_byte gray_1;
  uint entry;
  uint alpha;
  uint gray;
  png_const_bytep end_row;
  png_bytep outrow;
  png_bytep inrow;
  int local_58;
  png_uint_32 y;
  uint stepy;
  uint stepx;
  uint startx;
  int pass;
  ptrdiff_t step_row;
  png_bytep first_row;
  int proc;
  png_uint_32 width;
  png_uint_32 height;
  int passes;
  png_structrp png_ptr;
  png_imagep image;
  png_image_read_control *display;
  png_voidp argument_local;
  
  puVar5 = *argument;
  png_ptr_00 = *(png_const_structrp *)*puVar5;
  if (png_ptr_00->interlaced == '\0') {
    width = 1;
  }
  else {
    if (png_ptr_00->interlaced != '\x01') {
      png_error(png_ptr_00,"unknown interlace type");
    }
    width = 7;
  }
  uVar2 = *(uint *)(puVar5 + 2);
  uVar3 = *(uint *)((long)puVar5 + 0xc);
  uVar4 = *(undefined4 *)((long)argument + 0x48);
  lVar6 = *(long *)((long)argument + 0x30);
  lVar7 = *(long *)((long)argument + 0x38);
  stepx = 0;
  do {
    if ((int)width <= (int)stepx) {
      return 1;
    }
    if (png_ptr_00->interlaced == '\x01') {
      if ((int)stepx < 2) {
        local_9c = 3;
      }
      else {
        local_9c = (byte)((int)(7 - stepx) >> 1);
      }
      if ((int)stepx < 2) {
        local_a8 = 3;
      }
      else {
        local_a8 = (byte)((int)(7 - stepx) >> 1);
      }
      if (uVar3 + (((1 << (local_9c & 0x1f)) + -1) -
                  ((stepx & 1) << (3U - (char)((int)(stepx + 1) >> 1) & 0x1f) & 7)) >>
          (local_a8 & 0x1f) != 0) {
        stepy = (stepx & 1) << (3U - (char)((int)(stepx + 1) >> 1) & 0x1f) & 7;
        y = 1 << ((byte)((int)(7 - stepx) >> 1) & 0x1f);
        inrow._4_4_ = ((stepx ^ 0xffffffff) & 1) << (3U - (char)((int)stepx >> 1) & 0x1f) & 7;
        if ((int)stepx < 3) {
          local_ac = 8;
        }
        else {
          local_ac = 8 >> ((byte)((int)(stepx - 1) >> 1) & 0x1f);
        }
        local_58 = local_ac;
        goto LAB_00117e67;
      }
    }
    else {
      inrow._4_4_ = 0;
      stepy = 0;
      local_58 = 1;
      y = 1;
LAB_00117e67:
      for (; inrow._4_4_ < uVar2; inrow._4_4_ = local_58 + inrow._4_4_) {
        outrow = *(png_bytep *)((long)argument + 0x28);
        lVar10 = lVar6 + (ulong)inrow._4_4_ * lVar7;
        ppVar11 = (png_const_bytep)(lVar10 + (ulong)uVar3);
        png_read_row(png_ptr_00,outrow,(png_bytep)0x0);
        end_row = (png_const_bytep)(lVar10 + (ulong)stepy);
        switch(uVar4) {
        case 1:
          for (; end_row < ppVar11; end_row = end_row + y) {
            pbVar12 = outrow + 1;
            bVar1 = *outrow;
            outrow = outrow + 2;
            uVar9 = (uint)*pbVar12;
            if (uVar9 < 0xe6) {
              if (uVar9 < 0x1a) {
                alpha_2._0_1_ = 0xe7;
              }
              else {
                alpha_2._0_1_ =
                     (char)(uVar9 * 5 + 0x82 >> 8) * '\x06' + -0x1e +
                     (char)((uint)bVar1 * 5 + 0x82 >> 8);
              }
            }
            else {
              alpha_2._0_1_ = (png_byte)((uint)bVar1 * 0xe7 + 0x80 >> 8);
            }
            *end_row = (png_byte)alpha_2;
          }
          break;
        case 2:
          for (; end_row < ppVar11; end_row = end_row + y) {
            ppVar13 = outrow + 1;
            pVar8 = *outrow;
            outrow = outrow + 2;
            if (*ppVar13 == '\0') {
              *end_row = 0xfe;
            }
            else if (pVar8 == 0xfe) {
              *end_row = 0xff;
            }
            else {
              *end_row = pVar8;
            }
          }
          break;
        case 3:
          for (; end_row < ppVar11; end_row = end_row + y) {
            *end_row = ((char)((uint)*outrow * 5 + 0x82 >> 8) * '\x06' +
                       (char)((uint)outrow[1] * 5 + 0x82 >> 8)) * '\x06' +
                       (char)((uint)outrow[2] * 5 + 0x82 >> 8);
            outrow = outrow + 3;
          }
          break;
        case 4:
          for (; end_row < ppVar11; end_row = end_row + y) {
            if (outrow[3] < 0xc4) {
              if (outrow[3] < 0x40) {
                *end_row = 0xd8;
              }
              else {
                pVar8 = 0xd9;
                if ((*outrow & 0x80) != 0) {
                  pVar8 = 0xe2;
                }
                if ((*outrow & 0x40) != 0) {
                  pVar8 = pVar8 + '\t';
                }
                if ((*outrow & 0x80) != 0) {
                  pVar8 = pVar8 + '\x03';
                }
                if ((*outrow & 0x40) != 0) {
                  pVar8 = pVar8 + '\x03';
                }
                if ((*outrow & 0x80) != 0) {
                  pVar8 = pVar8 + '\x01';
                }
                if ((*outrow & 0x40) != 0) {
                  pVar8 = pVar8 + '\x01';
                }
                *end_row = pVar8;
              }
            }
            else {
              *end_row = ((char)((uint)*outrow * 5 + 0x82 >> 8) * '\x06' +
                         (char)((uint)outrow[1] * 5 + 0x82 >> 8)) * '\x06' +
                         (char)((uint)outrow[2] * 5 + 0x82 >> 8);
            }
            outrow = outrow + 4;
          }
        }
      }
    }
    stepx = stepx + 1;
  } while( true );
}

Assistant:

static int
png_image_read_and_map(png_voidp argument)
{
   png_image_read_control *display = png_voidcast(png_image_read_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;
   int passes;

   /* Called when the libpng data must be transformed into the color-mapped
    * form.  There is a local row buffer in display->local and this routine must
    * do the interlace handling.
    */
   switch (png_ptr->interlaced)
   {
      case PNG_INTERLACE_NONE:
         passes = 1;
         break;

      case PNG_INTERLACE_ADAM7:
         passes = PNG_INTERLACE_ADAM7_PASSES;
         break;

      default:
         png_error(png_ptr, "unknown interlace type");
   }

   {
      png_uint_32  height = image->height;
      png_uint_32  width = image->width;
      int          proc = display->colormap_processing;
      png_bytep    first_row = png_voidcast(png_bytep, display->first_row);
      ptrdiff_t    step_row = display->row_bytes;
      int pass;

      for (pass = 0; pass < passes; ++pass)
      {
         unsigned int     startx, stepx, stepy;
         png_uint_32      y;

         if (png_ptr->interlaced == PNG_INTERLACE_ADAM7)
         {
            /* The row may be empty for a short image: */
            if (PNG_PASS_COLS(width, pass) == 0)
               continue;

            startx = PNG_PASS_START_COL(pass);
            stepx = PNG_PASS_COL_OFFSET(pass);
            y = PNG_PASS_START_ROW(pass);
            stepy = PNG_PASS_ROW_OFFSET(pass);
         }

         else
         {
            y = 0;
            startx = 0;
            stepx = stepy = 1;
         }

         for (; y<height; y += stepy)
         {
            png_bytep inrow = png_voidcast(png_bytep, display->local_row);
            png_bytep outrow = first_row + y * step_row;
            png_const_bytep end_row = outrow + width;

            /* Read read the libpng data into the temporary buffer. */
            png_read_row(png_ptr, inrow, NULL);

            /* Now process the row according to the processing option, note
             * that the caller verifies that the format of the libpng output
             * data is as required.
             */
            outrow += startx;
            switch (proc)
            {
               case PNG_CMAP_GA:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     /* The data is always in the PNG order */
                     unsigned int gray = *inrow++;
                     unsigned int alpha = *inrow++;
                     unsigned int entry;

                     /* NOTE: this code is copied as a comment in
                      * make_ga_colormap above.  Please update the
                      * comment if you change this code!
                      */
                     if (alpha > 229) /* opaque */
                     {
                        entry = (231 * gray + 128) >> 8;
                     }
                     else if (alpha < 26) /* transparent */
                     {
                        entry = 231;
                     }
                     else /* partially opaque */
                     {
                        entry = 226 + 6 * PNG_DIV51(alpha) + PNG_DIV51(gray);
                     }

                     *outrow = (png_byte)entry;
                  }
                  break;

               case PNG_CMAP_TRANS:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     png_byte gray = *inrow++;
                     png_byte alpha = *inrow++;

                     if (alpha == 0)
                        *outrow = PNG_CMAP_TRANS_BACKGROUND;

                     else if (gray != PNG_CMAP_TRANS_BACKGROUND)
                        *outrow = gray;

                     else
                        *outrow = (png_byte)(PNG_CMAP_TRANS_BACKGROUND+1);
                  }
                  break;

               case PNG_CMAP_RGB:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     *outrow = PNG_RGB_INDEX(inrow[0], inrow[1], inrow[2]);
                     inrow += 3;
                  }
                  break;

               case PNG_CMAP_RGB_ALPHA:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     unsigned int alpha = inrow[3];

                     /* Because the alpha entries only hold alpha==0.5 values
                      * split the processing at alpha==0.25 (64) and 0.75
                      * (196).
                      */

                     if (alpha >= 196)
                        *outrow = PNG_RGB_INDEX(inrow[0], inrow[1],
                            inrow[2]);

                     else if (alpha < 64)
                        *outrow = PNG_CMAP_RGB_ALPHA_BACKGROUND;

                     else
                     {
                        /* Likewise there are three entries for each of r, g
                         * and b.  We could select the entry by popcount on
                         * the top two bits on those architectures that
                         * support it, this is what the code below does,
                         * crudely.
                         */
                        unsigned int back_i = PNG_CMAP_RGB_ALPHA_BACKGROUND+1;

                        /* Here are how the values map:
                         *
                         * 0x00 .. 0x3f -> 0
                         * 0x40 .. 0xbf -> 1
                         * 0xc0 .. 0xff -> 2
                         *
                         * So, as above with the explicit alpha checks, the
                         * breakpoints are at 64 and 196.
                         */
                        if (inrow[0] & 0x80) back_i += 9; /* red */
                        if (inrow[0] & 0x40) back_i += 9;
                        if (inrow[0] & 0x80) back_i += 3; /* green */
                        if (inrow[0] & 0x40) back_i += 3;
                        if (inrow[0] & 0x80) back_i += 1; /* blue */
                        if (inrow[0] & 0x40) back_i += 1;

                        *outrow = (png_byte)back_i;
                     }

                     inrow += 4;
                  }
                  break;

               default:
                  break;
            }
         }
      }
   }

   return 1;
}